

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O0

void MultiplicativeExpression_mod_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  undefined1 local_88 [8];
  JsValue r4;
  JsValue r3;
  JsValue r2;
  JsValue r1;
  JsAstBinaryNode *n;
  JsValue *res_local;
  JsContext *context_local;
  JsAstNode *na_local;
  
  (*JsNodeClassEval[**(uint **)(na + 1)])
            (*(JsAstNode **)(na + 1),context,(JsValue *)((long)&r2.u + 8));
  JsGetValue((JsValue *)((long)&r2.u + 8),(JsValue *)((long)&r3.u + 8));
  (*JsNodeClassEval[*(uint *)&(na[1].location)->filename])
            ((JsAstNode *)na[1].location,context,(JsValue *)((long)&r4.u + 8));
  JsGetValue((JsValue *)((long)&r4.u + 8),(JsValue *)local_88);
  MultiplicativeExpression_mod_common((JsValue *)((long)&r3.u + 8),(JsValue *)local_88,context,res);
  return;
}

Assistant:

static void
MultiplicativeExpression_mod_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstBinaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstBinaryNode *n = CAST_NODE(na, JsAstBinaryNode);
	struct JsValue r1, r2, r3, r4;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	EVAL(n->b, context, &r3);
	JsGetValue( &r3, &r4);
	MultiplicativeExpression_mod_common(&r2, &r4, context, res);
}